

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool leveldb::Version::Get(leveldb::ReadOptions_const&,leveldb::LookupKey_const&,std::__cxx11::
     string*,leveldb::Version::GetStats*)::State::Match(void*,int,leveldb::FileMetaData__
               (void *arg,int level,FileMetaData *f)

{
  bool bVar1;
  Slice local_50;
  Status local_40;
  Status local_38;
  undefined4 *local_30;
  State *state;
  FileMetaData *f_local;
  undefined8 uStack_18;
  int level_local;
  void *arg_local;
  
  if ((**(long **)((long)arg + 0x28) == 0) && (*(long *)((long)arg + 0x48) != 0)) {
    **(undefined8 **)((long)arg + 0x28) = *(undefined8 *)((long)arg + 0x48);
    *(undefined4 *)(*(long *)((long)arg + 0x28) + 8) = *(undefined4 *)((long)arg + 0x50);
  }
  *(FileMetaData **)((long)arg + 0x48) = f;
  *(int *)((long)arg + 0x50) = level;
  local_30 = (undefined4 *)arg;
  state = (State *)f;
  f_local._4_4_ = level;
  uStack_18 = arg;
  TableCache::Get((TableCache *)&local_38,*(ReadOptions **)(*(long *)((long)arg + 0x58) + 0x30),
                  *(uint64_t *)((long)arg + 0x30),f->number,(Slice *)f->file_size,
                  (void *)((long)arg + 0x38),(_func_void_void_ptr_Slice_ptr_Slice_ptr *)arg);
  Status::operator=((Status *)(local_30 + 0x18),&local_38);
  Status::~Status(&local_38);
  bVar1 = Status::ok((Status *)(local_30 + 0x18));
  if (bVar1) {
    switch(*local_30) {
    case 0:
      arg_local._7_1_ = true;
      break;
    case 1:
      *(undefined1 *)(local_30 + 0x1a) = 1;
      arg_local._7_1_ = false;
      break;
    case 2:
      arg_local._7_1_ = false;
      break;
    case 3:
      Slice::Slice(&local_50,"corrupted key for ");
      Status::Corruption(&local_40,&local_50,(Slice *)(local_30 + 4));
      Status::operator=((Status *)(local_30 + 0x18),&local_40);
      Status::~Status(&local_40);
      *(undefined1 *)(local_30 + 0x1a) = 1;
      arg_local._7_1_ = false;
      break;
    default:
      arg_local._7_1_ = false;
    }
  }
  else {
    *(undefined1 *)(local_30 + 0x1a) = 1;
    arg_local._7_1_ = false;
  }
  return arg_local._7_1_;
}

Assistant:

static bool Match(void* arg, int level, FileMetaData* f) {
      State* state = reinterpret_cast<State*>(arg);

      if (state->stats->seek_file == nullptr &&
          state->last_file_read != nullptr) {
        // We have had more than one seek for this read.  Charge the 1st file.
        state->stats->seek_file = state->last_file_read;
        state->stats->seek_file_level = state->last_file_read_level;
      }

      state->last_file_read = f;
      state->last_file_read_level = level;

      state->s = state->vset->table_cache_->Get(*state->options, f->number,
                                                f->file_size, state->ikey,
                                                &state->saver, SaveValue);
      if (!state->s.ok()) {
        state->found = true;
        return false;
      }
      switch (state->saver.state) {
        case kNotFound:
          return true;  // Keep searching in other files
        case kFound:
          state->found = true;
          return false;
        case kDeleted:
          return false;
        case kCorrupt:
          state->s =
              Status::Corruption("corrupted key for ", state->saver.user_key);
          state->found = true;
          return false;
      }

      // Not reached. Added to avoid false compilation warnings of
      // "control reaches end of non-void function".
      return false;
    }